

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CClassList *stm)

{
  pointer puVar1;
  __uniq_ptr_impl<CClass,_std::default_delete<CClass>_> _Var2;
  int index;
  ulong uVar3;
  string *this_00;
  undefined1 local_60 [48];
  
  std::operator<<((ostream *)&std::cout,"typechecker: classlist\n");
  uVar3 = 0;
  do {
    puVar1 = (stm->classes).
             super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(stm->classes).
                      super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar3) {
      TypeInfo::TypeInfo((TypeInfo *)local_60,VOID);
      TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_60);
      this_00 = (string *)(local_60 + 8);
LAB_0011e24f:
      std::__cxx11::string::~string(this_00);
      return;
    }
    if ((_Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>)
        puVar1[uVar3]._M_t.super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>._M_t ==
        (_Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>)0x0) {
      CError::CError((CError *)local_60,&CError::AST_ERROR_abi_cxx11_,
                     &(stm->super_IWrapper).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)local_60);
      this_00 = (string *)local_60;
      goto LAB_0011e24f;
    }
    std::operator<<((ostream *)&std::cout,"Accepting of class: \n");
    std::operator<<((ostream *)&std::cout,
                    (string *)
                    (*(long *)((long)(stm->classes).
                                     super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_t.
                                     super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>.
                                     _M_t + 0x18) + 0x18));
    std::operator<<((ostream *)&std::cout,"\nLet\'s begin\n");
    _Var2._M_t.super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
    super__Head_base<0UL,_CClass_*,_false>._M_head_impl =
         (stm->classes).
         super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_t.
         super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>._M_t;
    (*(code *)**(undefined8 **)
                _Var2._M_t.super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
                super__Head_base<0UL,_CClass_*,_false>._M_head_impl)
              (_Var2._M_t.super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
               super__Head_base<0UL,_CClass_*,_false>._M_head_impl,this);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void CTypeCheckerVisitor::Visit( CClassList &stm ) 
{
	std::cout << "typechecker: classlist\n";
    bool areAllClassBuilt = true;
    for (int index = 0; index < stm.classes.size(); ++index) {;
        if( !stm.classes[index]) {
            areAllClassBuilt = false;
            break;
        }
        std::cout << "Accepting of class: \n";
        std::cout << stm.classes[index]->id->name;
        std::cout << "\nLet's begin\n";
        stm.classes[index]->Accept( *this );
    }
    if( areAllClassBuilt ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}